

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.c
# Opt level: O1

int menu_screen(tgestate_t *state)

{
  attribute_t *paVar1;
  uint8_t uVar2;
  zxspectrum_t *pzVar3;
  byte bVar4;
  byte bVar5;
  uint16_t uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *puVar10;
  undefined6 extraout_var;
  int iVar11;
  long lVar12;
  char cVar13;
  ulong unaff_R12;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  ulong uVar17;
  char *pcharacter;
  keydefs_t *pkVar18;
  int iVar19;
  ushort *puVar20;
  byte *pcharacter_00;
  bool bVar21;
  uint8_t speaker1;
  uint8_t speaker0;
  byte local_6e;
  byte local_6d;
  uint local_6c;
  uint local_68;
  int local_64;
  keydefs_t *local_60;
  keydefs_t *local_58;
  ushort *local_50;
  long local_48;
  uint8_t *local_40;
  ulong local_38;
  
  (*state->speccy->stamp)(state->speccy);
  bVar4 = (*state->speccy->in)(state->speccy,0xf7fe);
  if ((bVar4 & 0xf) == 0xf) {
    bVar4 = (*state->speccy->in)(state->speccy,0xeffe);
    cVar13 = -(bVar4 & 1);
  }
  else {
    bVar4 = bVar4 & 0xf ^ 0xf;
    cVar13 = '\x01';
    do {
      if ((bVar4 & 1) != 0) goto LAB_0010bc9d;
      bVar4 = bVar4 >> 1;
      cVar13 = cVar13 + '\x01';
    } while (cVar13 != '\x05');
    cVar13 = '\x04';
  }
LAB_0010bc9d:
  if (cVar13 != '\0') {
    bVar21 = false;
    iVar11 = 0;
    if (cVar13 != -1) {
      bVar4 = cVar13 - 1;
      pzVar3 = state->speccy;
      lVar12 = (long)state->width * (long)(int)state->chosen_input_device;
      builtin_memcpy((pzVar3->screen).attributes + lVar12 * 2 + 0x10d,"\a\a\a\a\a\a\a\a",8);
      paVar1 = (pzVar3->screen).attributes + lVar12 * 2 + 0x115;
      paVar1[0] = '\a';
      paVar1[1] = '\a';
      invalidate_attrs(state,(pzVar3->screen).attributes + lVar12 * 2 + 0x10d,0x50,8);
      state->chosen_input_device = (uint)bVar4;
      lVar12 = (long)state->width * (ulong)((uint)bVar4 + (uint)bVar4);
      builtin_memcpy((state->speccy->screen).attributes + lVar12 + 0x10d,"FFFFFFFFFF",10);
      invalidate_attrs(state,(state->speccy->screen).attributes + lVar12 + 0x10d,0x50,8);
      iVar11 = 1;
      bVar21 = false;
    }
    goto LAB_0010c0e2;
  }
  if (state->chosen_input_device == inputdevice_KEYBOARD) {
    local_40 = (state->speccy->screen).pixels;
    local_48 = 0x47;
    local_58 = &state->keydefs;
    do {
      pzVar3 = state->speccy;
      iVar11 = state->rows;
      uVar17 = 0;
      do {
        memset((pzVar3->screen).pixels + game_window_start_offsets[uVar17],0,
               (long)state->columns - 1);
        uVar17 = uVar17 + 1;
      } while ((char)((char)iVar11 * '\b' + -8) != (char)uVar17);
      invalidate_bitmap(state,(pzVar3->screen).pixels + local_48,state->columns << 3,
                        state->rows * 8 + -8);
      set_game_window_attributes(state,'\a');
      cVar13 = '\x06';
      puVar20 = &choose_keys_choose_key_prompts;
      do {
        puVar10 = (state->speccy->screen).pixels + *puVar20;
        uVar17 = CONCAT71((int7)(uVar17 >> 8),(char)puVar20[1]);
        pcharacter = *(char **)(puVar20 + 4);
        do {
          puVar10 = plot_glyph(state,pcharacter,puVar10);
          pcharacter = pcharacter + 1;
          cVar16 = (char)uVar17 + -1;
          uVar17 = CONCAT71((int7)(uVar17 >> 8),cVar16);
        } while (cVar16 != '\0');
        puVar20 = puVar20 + 8;
        cVar13 = cVar13 + -1;
      } while (cVar13 != '\0');
      local_58->defs[4].port = '\0';
      local_58->defs[4].mask = '\0';
      local_58->defs[0].port = '\0';
      local_58->defs[0].mask = '\0';
      local_58->defs[1].port = '\0';
      local_58->defs[1].mask = '\0';
      local_58->defs[2].port = '\0';
      local_58->defs[2].mask = '\0';
      local_58->defs[3].port = '\0';
      local_58->defs[3].mask = '\0';
      cVar13 = '\x05';
      local_68 = 0;
      puVar20 = &choose_keys_key_name_screen_offsets;
      pkVar18 = local_60;
      do {
        local_38 = (ulong)*puVar20;
        local_50 = puVar20;
        iVar11 = menudelay(state,70000);
        uVar17 = CONCAT71((int7)(uVar17 >> 8),0xff);
        bVar21 = iVar11 == 0;
        if (bVar21) {
LAB_0010beae:
          do {
            local_60 = pkVar18;
            uVar15 = uVar17 & 0xffffffff;
            uVar8 = (uint)uVar17;
            uVar17 = CONCAT71((int7)(uVar17 >> 8),0xf7);
            lVar12 = 0x10f7da;
            uVar9 = 0;
            do {
              local_68 = uVar9;
              local_6c = CONCAT31(local_6c._1_3_,(char)uVar17);
              bVar4 = (*state->speccy->in)
                                (state->speccy,(ushort)(((uint)uVar17 & 0xff) << 8) | 0xfe);
              uVar14 = 0x20;
              while( true ) {
                uVar9 = (uint)uVar14 >> 1;
                unaff_R12 = (ulong)uVar9;
                if ((uVar14 & 1) != 0) break;
                bVar5 = (byte)uVar9 & ~bVar4;
                uVar14 = unaff_R12;
                if (bVar5 != 0) {
                  uVar17 = uVar15;
                  uVar8 = (uint)bVar5;
                  if ((char)uVar15 != '\0') goto LAB_0010bf22;
                  uVar2 = local_58->defs[0].port;
                  uVar17 = CONCAT71((int7)(uVar15 >> 8),uVar2);
                  pkVar18 = local_58;
                  goto joined_r0x0010bf56;
                }
              }
              uVar17 = CONCAT71((int7)(uVar17 >> 8),*(undefined1 *)(lVar12 + 1));
              lVar12 = lVar12 + 1;
              uVar9 = CONCAT31((int3)(local_68 >> 8),(char)local_68 + '\x01');
            } while (lVar12 != 0x10f7e2);
LAB_0010bf22:
            iVar11 = menudelay(state,70000);
            bVar21 = iVar11 == 0;
            pkVar18 = local_60;
          } while (bVar21);
          local_64 = -1;
          local_68 = uVar8;
          goto LAB_0010bfc2;
        }
LAB_0010be93:
        local_64 = -1;
LAB_0010bfc2:
        if (bVar21) {
          pkVar18->defs[0].port = (uint8_t)local_6c;
          pkVar18->defs[0].mask = (uint8_t)unaff_R12;
          pcharacter_00 = &UNK_0010f80f + (ulong)(byte)local_68 * 5;
          uVar15 = unaff_R12;
          do {
            pcharacter_00 = pcharacter_00 + 1;
            unaff_R12 = uVar15 >> 1 & 0x7f;
            uVar14 = uVar15 & 1;
            uVar15 = unaff_R12;
          } while (uVar14 == 0);
          cVar16 = '\x01';
          if ((char)*pcharacter_00 < '\0') {
            uVar8 = *pcharacter_00 & 0x7f;
            pcharacter_00 = &UNK_0010f7f1 + uVar8;
            cVar16 = (&choose_keys_special_key_names)[uVar8];
          }
          puVar10 = local_40 + local_38;
          do {
            puVar10 = plot_glyph(state,(char *)pcharacter_00,puVar10);
            pcharacter_00 = pcharacter_00 + 1;
            cVar16 = cVar16 + -1;
          } while (cVar16 != '\0');
          local_68 = (uint)uVar17;
        }
        if (!bVar21) goto LAB_0010c0a0;
        puVar20 = local_50 + 1;
        cVar13 = cVar13 + -1;
      } while (cVar13 != '\0');
      iVar11 = menudelay(state,350000);
      if (iVar11 == 0) {
        iVar11 = user_confirm(state);
        bVar21 = iVar11 != 0;
        if (!bVar21) {
          local_64 = 1;
        }
      }
      else {
        local_64 = -1;
LAB_0010c0a0:
        bVar21 = false;
      }
      local_60 = pkVar18;
    } while (bVar21);
    if (-1 < local_64) goto LAB_0010c0db;
    iVar11 = -1;
  }
  else {
LAB_0010c0db:
    iVar11 = 2;
  }
  bVar21 = true;
LAB_0010c0e2:
  if (!bVar21) {
    wave_morale_flag(state);
    uVar8 = *(int *)&state->music_channel0_index + 1;
    do {
      state->music_channel0_index = (uint16_t)uVar8;
      uVar9 = uVar8 & 0xffff;
      uVar8 = 0;
    } while ("\x13"[uVar9] == 0xff);
    uVar6 = frequency_for_semitone("\x13"[uVar9],&local_6d);
    local_68 = (uint)CONCAT62(extraout_var,uVar6);
    uVar7 = state->music_channel1_index + 1;
    do {
      state->music_channel1_index = uVar7;
      uVar17 = (ulong)uVar7;
      uVar7 = 0;
    } while ("\n"[uVar17] == 0xff);
    uVar6 = frequency_for_semitone("\n"[uVar17],&local_6e);
    uVar8 = (uint)uVar6;
    if (0xfeff < uVar6) {
      uVar8 = local_68;
    }
    cVar13 = '\x18';
    bVar4 = 0;
    uVar9 = local_68;
    local_6c = uVar8;
    do {
      cVar16 = -1;
      do {
        uVar9 = uVar9 & 0xffff;
        iVar11 = (uVar9 >> 8) + 0xff;
        if (((char)iVar11 == '\0') && (bVar5 = (char)uVar9 - 1, uVar9 = (uint)bVar5, bVar5 == 0)) {
          local_6d = local_6d ^ 0x10;
          bVar4 = local_6d & 0x10;
          (*state->speccy->out)(state->speccy,0xfe,local_6d);
          iVar19 = 2;
          uVar9 = local_68;
        }
        else {
          iVar19 = 3;
          uVar9 = uVar9 & 0xff | iVar11 * 0x100;
        }
        uVar8 = uVar8 & 0xffff;
        iVar11 = (uVar8 >> 8) + 0xff;
        if (((char)iVar11 == '\0') && (bVar5 = (char)uVar8 - 1, uVar8 = (uint)bVar5, bVar5 == 0)) {
          local_6e = local_6e ^ 0x10;
          bVar4 = local_6e & 0x10;
          (*state->speccy->out)(state->speccy,0xfe,local_6e);
          iVar19 = iVar19 + -1;
          uVar8 = local_6c;
        }
        else {
          uVar8 = uVar8 & 0xff | iVar11 * 0x100;
        }
        iVar19 = iVar19 + 1;
        do {
          (*state->speccy->out)(state->speccy,0xfe,bVar4);
          iVar19 = iVar19 + -1;
        } while (1 < iVar19);
        cVar16 = cVar16 + -1;
      } while (cVar16 != '\0');
      cVar13 = cVar13 + -1;
    } while (cVar13 != '\0');
    iVar11 = (*state->speccy->sleep)(state->speccy,0x4954d);
    iVar11 = -(uint)(iVar11 != 0);
  }
  return iVar11;
joined_r0x0010bf56:
  if (uVar2 == '\0') goto LAB_0010bfc2;
  if (((uint8_t)uVar17 == (uint8_t)local_6c) && (uVar9 == pkVar18->defs[0].mask)) goto LAB_0010bf82;
  uVar2 = pkVar18->defs[1].port;
  uVar17 = CONCAT71((int7)(uVar17 >> 8),uVar2);
  pkVar18 = (keydefs_t *)(pkVar18->defs + 1);
  goto joined_r0x0010bf56;
LAB_0010bf82:
  iVar11 = menudelay(state,70000);
  bVar21 = iVar11 == 0;
  if (!bVar21) goto LAB_0010be93;
  goto LAB_0010beae;
}

Assistant:

int menu_screen(tgestate_t *state)
{
  int      menu_keys_state;
  uint16_t counter_0;       /* was BC */
  uint16_t counter_1;       /* was BC' */
  uint16_t frequency_0;     /* was DE */
  uint16_t frequency_1;     /* was DE' */
  uint8_t  datum;           /* was A */
  uint8_t  major_delay;     /* was A */
  uint8_t  minor_delay;     /* was H */
  uint16_t channel0_index;  /* was HL */
  uint16_t channel1_index;  /* was HL' */
  uint8_t  speaker0;        /* was L */
  uint8_t  speaker1;        /* was L' */
  uint8_t  B;               /* was B */
  uint8_t  C;               /* was C */
  uint8_t  Bdash;           /* was B' */
  uint8_t  Cdash;           /* was C' */
  uint8_t  bit = 0; // most recently emitted bit

  assert(state != NULL);

  state->speccy->stamp(state->speccy);

  /* Conv: Menu driving loop was removed and the routine changed to return
   * non-zero when the game should begin. */
  menu_keys_state = check_menu_keys(state);
  if (menu_keys_state < 0 || menu_keys_state >= 2)
    return menu_keys_state; /* Start the game, or terminate the game thread */

  wave_morale_flag(state);

  /* Play music */

  channel0_index = state->music_channel0_index + 1;
  for (;;)
  {
    state->music_channel0_index = channel0_index;
    datum = music_channel0_data[channel0_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel0_index = 0;
  }
  frequency_0 = counter_0 = frequency_for_semitone(datum, &speaker0);

  channel1_index = state->music_channel1_index + 1;
  for (;;)
  {
    state->music_channel1_index = channel1_index;
    datum = music_channel1_data[channel1_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel1_index = 0;
  }
  frequency_1 = counter_1 = frequency_for_semitone(datum, &speaker1);

  /* When the second channel is silent use the first channel's frequency. */
  if ((counter_1 >> 8) == 0xFF) // (BCdash >> 8) was Bdash;
    frequency_1 = counter_1 = counter_0;

  major_delay = 24; /* overall tune speed (a delay: lower values are faster) */
  do
  {
    minor_delay = 255;
    do
    {
      int to_emit = 3; // Conv: Whatever we do always emit this many bits

      // B,C are a pair of counters? half pulse length?
      // B = lo, C = hi  (in this routine)

      B = counter_0 >> 8;
      C = counter_0 & 0xFF;
      if (--B == 0 && --C == 0)
      {
        speaker0 ^= port_MASK_EAR;
        bit = speaker0 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker0);
        to_emit--;
        counter_0 = frequency_0;
      }
      else
      {
        counter_0 = (B << 8) | C;
      }

      Bdash = counter_1 >> 8;
      Cdash = counter_1 & 0xFF;
      if (--Bdash == 0 && --Cdash == 0)
      {
        speaker1 ^= port_MASK_EAR;
        bit = speaker1 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker1);
        to_emit--;
        counter_1 = frequency_1;
      }
      else
      {
        counter_1 = (Bdash << 8) | Cdash;
      }

      /* Conv: We simulate the EAR port holding its level by adding extra
       * OUTs here. */
      // FIXME: The timing needs working out here: 3 OUTs per loop works,
      // but why?
      while (to_emit-- > 0)
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, bit);
    }
    while (--minor_delay);
  }
  while (--major_delay);

  /* Conv: Timing: Calibrated to original game. */
  if (state->speccy->sleep(state->speccy, 300365))
    return -1; /* Terminate the game thread */

  return 0; /* Don't start the game */
}